

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

int memieq(void *a,void *b,size_t n)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t *bb;
  uint8_t *aa;
  size_t i;
  size_t n_local;
  void *b_local;
  void *a_local;
  
  aa = (uint8_t *)0x0;
  while( true ) {
    if (n <= aa) {
      return 1;
    }
    uVar1 = downcase(*(uint8_t *)((long)a + (long)aa));
    uVar2 = downcase(*(uint8_t *)((long)b + (long)aa));
    if (uVar1 != uVar2) break;
    aa = aa + 1;
  }
  return 0;
}

Assistant:

static int memieq(const void *a, const void *b, size_t n) {
  size_t i;
  const uint8_t *aa = a, *bb = b;

  for (i = 0; i < n; ++i) {
    if (downcase(aa[i]) != downcase(bb[i])) {
      return 0;
    }
  }
  return 1;
}